

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.h
# Opt level: O3

bool script::Func(string *str,Span<const_char> *sp)

{
  long lVar1;
  ulong uVar2;
  size_t __n;
  char *__s2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = sp->m_size;
  __n = str->_M_string_length;
  if (((uVar2 < __n + 2) || (__s2 = sp->m_data, __s2[__n] != '(')) || (__s2[uVar2 - 1] != ')')) {
LAB_0018ee55:
    bVar3 = false;
  }
  else {
    if (__n != 0) {
      iVar4 = bcmp((str->_M_dataplus)._M_p,__s2,__n);
      if (iVar4 != 0) goto LAB_0018ee55;
    }
    sp->m_data = __s2 + __n + 1;
    sp->m_size = (uVar2 - __n) - 2;
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

constexpr std::size_t size() const noexcept { return m_size; }